

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

symbol * Symbol_new(char *x)

{
  byte *pbVar1;
  ushort *puVar2;
  int iVar3;
  int iVar4;
  symbol *psVar5;
  symbol *psVar6;
  char *pcVar7;
  ushort **ppuVar8;
  FILE *__stream;
  ulong uVar9;
  byte *filebuf;
  size_t sVar10;
  long lVar11;
  long lVar12;
  byte *pbVar13;
  rule *prVar14;
  undefined8 *puVar15;
  symbol **ppsVar16;
  undefined8 *puVar17;
  long *__ptr;
  void *pvVar18;
  symbol *extraout_RAX;
  symbol *extraout_RAX_00;
  undefined4 extraout_var;
  byte bVar19;
  ulong uVar20;
  char cVar21;
  int iVar22;
  int iVar23;
  byte *__s2;
  byte bVar24;
  byte bVar25;
  long lVar26;
  char *pcVar27;
  uint uVar28;
  uint uVar29;
  size_t sVar30;
  long lVar31;
  byte *pbVar32;
  byte *pbVar33;
  byte *pbVar34;
  ulong uVar35;
  ulong uVar36;
  char **ppcVar37;
  bool bVar38;
  bool bVar39;
  size_t sStack_3fe8;
  int iStack_3fc4;
  char acStack_3f90 [56];
  char *pcStack_3f58;
  uint uStack_3f50;
  uint uStack_3f4c;
  byte *pbStack_3f48;
  long lStack_3f40;
  undefined4 uStack_3f38;
  symbol *psStack_3f30;
  symbol *psStack_3f28;
  symbol *psStack_3f20;
  byte *pbStack_3f18;
  uint uStack_3f10;
  long alStack_3f08 [999];
  undefined8 auStack_1fd0 [1001];
  rule *prStack_88;
  byte *pbStack_80;
  char **ppcStack_78;
  int iStack_70;
  int *piStack_68;
  undefined4 uStack_60;
  int iStack_5c;
  long lStack_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  symbol *psStack_48;
  
  psVar5 = Symbol_find(x);
  psVar6 = psVar5;
  if (psVar5 == (symbol *)0x0) {
    lVar26 = 1;
    psVar6 = (symbol *)calloc(1,0x60);
    if (psVar6 == (symbol *)0x0) {
      Symbol_new_cold_1();
      psStack_48 = psVar5;
      memset(&uStack_3f50,0,0x3f08);
      pcVar7 = *(char **)(lVar26 + 0xc0);
      uStack_3f38 = 0;
      pcStack_3f58 = pcVar7;
      lStack_3f40 = lVar26;
      __stream = fopen(pcVar7,"rb");
      if (__stream == (FILE *)0x0) {
        Parse_cold_11();
        psVar6 = extraout_RAX;
      }
      else {
        fseek(__stream,0,2);
        uVar9 = ftell(__stream);
        rewind(__stream);
        filebuf = (byte *)malloc((long)((uVar9 << 0x20) + 0x100000000) >> 0x20);
        if (((int)uVar9 < 0x5f5e101) && (filebuf != (byte *)0x0)) {
          sVar30 = (long)(uVar9 << 0x20) >> 0x20;
          sVar10 = fread(filebuf,1,sVar30,__stream);
          if (sVar10 != sVar30) {
            ErrorMsg(pcVar7,0,"Can\'t read in all %d bytes of this file.",uVar9 & 0xffffffff);
            free(filebuf);
            *(int *)(lVar26 + 0x38) = *(int *)(lVar26 + 0x38) + 1;
            iVar3 = fclose(__stream);
            return (symbol *)CONCAT44(extraout_var,iVar3);
          }
          fclose(__stream);
          iVar3 = strip_crlf((char *)filebuf,(int)uVar9);
          filebuf[iVar3] = 0;
          ppcVar37 = azDefine;
          iVar3 = nDefine;
          uVar9 = (ulong)(uint)nDefine;
          lVar11 = (long)nDefine;
          pbVar34 = filebuf + 6;
          lVar31 = 0;
          iVar23 = 0;
          iStack_3fc4 = 0;
          uVar35 = 6;
          pbVar32 = filebuf + 1;
          pbVar33 = filebuf;
          do {
            bVar24 = filebuf[lVar31];
            if (bVar24 != 10) {
              if (bVar24 == 0x25) {
                pbVar13 = filebuf + lVar31;
                if ((lVar31 == 0) || (pbVar13[-1] == 10)) {
                  iVar4 = strncmp((char *)pbVar13,"%endif",6);
                  if ((iVar4 == 0) &&
                     (ppuVar8 = __ctype_b_loc(),
                     (*(byte *)((long)*ppuVar8 + (ulong)pbVar13[6] * 2 + 1) & 0x20) != 0)) {
                    pbVar13 = pbVar33;
                    if (iVar23 == 0) {
                      iVar23 = 0;
                    }
                    else {
                      iVar23 = iVar23 + -1;
                      if (iVar23 == 0) {
                        lVar12 = (long)iStack_3fc4;
                        if (lVar12 < lVar31) {
                          do {
                            if (filebuf[lVar12] != 10) {
                              filebuf[lVar12] = 0x20;
                            }
                            lVar12 = lVar12 + 1;
                          } while (lVar31 != lVar12);
                        }
                        iVar23 = 0;
                      }
                    }
                    for (; (*pbVar13 != 0 && (*pbVar13 != 10)); pbVar13 = pbVar13 + 1) {
                      *pbVar13 = 0x20;
                    }
                  }
                  else {
                    iVar4 = strncmp((char *)pbVar13,"%ifdef",6);
                    if (((iVar4 == 0) &&
                        (ppuVar8 = __ctype_b_loc(),
                        (*(byte *)((long)*ppuVar8 + (ulong)pbVar13[6] * 2 + 1) & 0x20) != 0)) ||
                       ((iVar4 = strncmp((char *)pbVar13,"%ifndef",7), iVar4 == 0 &&
                        (ppuVar8 = __ctype_b_loc(),
                        (*(byte *)((long)*ppuVar8 + (ulong)pbVar13[7] * 2 + 1) & 0x20) != 0)))) {
                      if (iVar23 == 0) {
                        ppuVar8 = __ctype_b_loc();
                        uVar20 = uVar35;
                        __s2 = pbVar34;
                        do {
                          pbVar1 = __s2 + 1;
                          __s2 = __s2 + 1;
                          uVar20 = uVar20 + 1;
                        } while ((*(byte *)((long)*ppuVar8 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
                        bVar24 = filebuf[uVar20 & 0xffffffff];
                        bVar39 = false;
                        uVar36 = 0;
                        if (bVar24 != 0) {
                          uVar36 = 0;
                          do {
                            if ((*(byte *)((long)*ppuVar8 + (ulong)bVar24 * 2 + 1) & 0x20) != 0)
                            break;
                            bVar24 = (filebuf + 1)[uVar36 + (uVar20 & 0xffffffff)];
                            uVar36 = uVar36 + 1;
                          } while (bVar24 != 0);
                        }
                        if (iVar3 < 1) {
                          bVar38 = true;
                        }
                        else {
                          bVar39 = true;
                          uVar20 = 1;
                          do {
                            pcVar7 = ppcVar37[uVar20 - 1];
                            iVar23 = strncmp(pcVar7,(char *)__s2,uVar36 & 0xffffffff);
                            if ((iVar23 == 0) &&
                               (sVar10 = strlen(pcVar7), (int)uVar36 == (int)sVar10)) {
                              bVar38 = false;
                              goto LAB_0010688e;
                            }
                            bVar39 = (long)uVar20 < lVar11;
                            bVar38 = uVar20 != uVar9;
                            uVar20 = uVar20 + 1;
                          } while (bVar38);
                          bVar38 = true;
                        }
LAB_0010688e:
                        if (pbVar13[3] != 0x6e) {
                          bVar39 = bVar38;
                        }
                        if (bVar39) {
                          iVar23 = 1;
                          iStack_3fc4 = (int)lVar31;
                        }
                        else {
                          iVar23 = 0;
                        }
                      }
                      else {
                        iVar23 = iVar23 + 1;
                      }
                      bVar24 = 0x25;
                      pbVar13 = pbVar32;
                      while ((bVar24 != 0 && (bVar24 != 10))) {
                        pbVar13[-1] = 0x20;
                        bVar24 = *pbVar13;
                        pbVar13 = pbVar13 + 1;
                      }
                    }
                  }
                }
              }
              else if (bVar24 == 0) goto LAB_001068d5;
            }
            lVar31 = lVar31 + 1;
            pbVar33 = pbVar33 + 1;
            pbVar34 = pbVar34 + 1;
            uVar35 = uVar35 + 1;
            pbVar32 = pbVar32 + 1;
          } while( true );
        }
        Parse_cold_10();
        psVar6 = extraout_RAX_00;
      }
      return psVar6;
    }
    pcVar7 = Strsafe(x);
    psVar6->name = pcVar7;
    ppuVar8 = __ctype_b_loc();
    psVar6->type = (uint)(((*ppuVar8)[(byte)*x] >> 8 & 1) == 0);
    psVar6->prec = -1;
    psVar6->assoc = UNK;
    Symbol_insert(psVar6,pcVar7);
  }
  psVar6->useCnt = psVar6->useCnt + 1;
  return psVar6;
LAB_001068d5:
  if (iVar23 != 0) {
    Parse_cold_1();
    if (x2a != (s_x2 *)0x0) {
      return (symbol *)(ulong)(uint)x2a->count;
    }
    return (symbol *)0x0;
  }
  pbVar34 = filebuf;
  uVar28 = 1;
LAB_001068e9:
  do {
    uVar9 = (ulong)*pbVar34;
    pbVar32 = pbVar34;
    while( true ) {
      cVar21 = (char)uVar9;
      iVar3 = (int)uVar9;
      if (cVar21 == '\n') {
        uVar28 = uVar28 + 1;
      }
      else if (iVar3 == 0) {
        free(filebuf);
        *(long *)(lVar26 + 8) = lStack_58;
        *(uint *)(lVar26 + 0x38) = uStack_3f4c;
        return (symbol *)(ulong)uStack_3f4c;
      }
      ppuVar8 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar8 + uVar9 * 2 + 1) & 0x20) != 0) {
        pbVar34 = pbVar32 + 1;
        goto LAB_001068e9;
      }
      pbVar33 = pbVar32;
      uVar29 = uVar28;
      if (cVar21 != '/') {
        if (cVar21 != '{') {
          if (iVar3 == 0x22) {
            do {
              pbVar34 = pbVar33 + 1;
              while( true ) {
                pbVar33 = pbVar34;
                bVar24 = *pbVar33;
                if (bVar24 == 10) break;
                pbVar34 = pbVar33 + 1;
                uStack_3f50 = uVar28;
                pbStack_3f48 = pbVar32;
                if (bVar24 == 0x22) goto LAB_00106b90;
                if (bVar24 == 0) {
                  Parse_cold_2();
                  pbVar34 = pbVar33;
                  goto LAB_00106b90;
                }
              }
              uVar29 = uVar29 + 1;
            } while( true );
          }
          goto LAB_001069dd;
        }
        bVar24 = pbVar32[1];
        pbVar34 = pbVar32 + 1;
        if (bVar24 == 0) goto LAB_001076c2;
        iVar3 = 1;
        pbVar13 = pbVar32;
        goto LAB_00106a6f;
      }
      if (pbVar32[1] != 0x2f) break;
      pbVar32 = pbVar32 + 2;
      while( true ) {
        bVar24 = *pbVar32;
        uVar9 = (ulong)bVar24;
        if ((bVar24 == 0) || (bVar24 == 10)) break;
        pbVar32 = pbVar32 + 1;
      }
    }
    if (pbVar32[1] != 0x2a) {
LAB_001069dd:
      puVar2 = *ppuVar8;
      if ((puVar2[uVar9] & 8) == 0) {
        if ((cVar21 == '/') || (iVar3 == 0x7c)) {
          if ((*(byte *)((long)puVar2 + (ulong)pbVar32[1] * 2 + 1) & 4) == 0) goto LAB_00106b7b;
          bVar24 = pbVar32[2];
          pbVar33 = pbVar32 + 2;
          while ((pbVar34 = pbVar33, uStack_3f50 = uVar28, pbStack_3f48 = pbVar32, bVar24 != 0 &&
                 ((bVar24 == 0x5f || ((puVar2[bVar24] & 8) != 0))))) {
            bVar24 = pbVar33[1];
            pbVar33 = pbVar33 + 1;
          }
        }
        else if (((iVar3 == 0x3a) && (pbVar32[1] == 0x3a)) && (pbVar32[2] == 0x3d)) {
          pbVar33 = pbVar32 + 3;
          pbVar34 = pbVar33;
          uStack_3f50 = uVar28;
          pbStack_3f48 = pbVar32;
        }
        else {
LAB_00106b7b:
          pbVar33 = pbVar32 + 1;
          pbVar34 = pbVar33;
          uStack_3f50 = uVar28;
          pbStack_3f48 = pbVar32;
        }
      }
      else {
        bVar24 = *pbVar32;
        while ((pbVar34 = pbVar33, uStack_3f50 = uVar28, pbStack_3f48 = pbVar32, bVar24 != 0 &&
               ((bVar24 == 0x5f || ((puVar2[bVar24] & 8) != 0))))) {
          bVar24 = pbVar33[1];
          pbVar33 = pbVar33 + 1;
        }
      }
      goto LAB_00106b90;
    }
    bVar24 = pbVar32[2];
    if (bVar24 == 0) {
      pbVar34 = pbVar32 + 2;
    }
    else {
      pbVar32 = pbVar32 + 3;
      do {
        pbVar34 = pbVar32;
        if (bVar24 == 10) {
          uVar28 = uVar28 + 1;
        }
        else if ((bVar24 == 0x2f) && (pbVar34[-2] == 0x2a)) {
          pbVar34 = pbVar34 + -1;
          lVar11 = 1;
          goto LAB_00106a4f;
        }
        bVar24 = *pbVar34;
        pbVar32 = pbVar34 + 1;
      } while (bVar24 != 0);
    }
    lVar11 = 0;
LAB_00106a4f:
    pbVar34 = pbVar34 + lVar11;
  } while( true );
LAB_00106a6f:
  do {
    pbVar33 = pbVar34;
    if ((iVar3 < 2) && (bVar24 == 0x7d)) {
      pbVar34 = pbVar13 + 2;
      uStack_3f50 = uVar28;
      pbStack_3f48 = pbVar32;
      goto LAB_00106b90;
    }
    if (bVar24 < 0x2f) {
      if (bVar24 == 10) {
LAB_00106b56:
        uVar29 = uVar29 + 1;
      }
      else if ((bVar24 == 0x22) || (bVar24 == 0x27)) {
        bVar19 = pbVar33[1];
        pbVar33 = pbVar33 + 1;
        if (bVar19 != 0) {
          bVar25 = 0;
          do {
            if ((bVar25 != 0x5c) && (bVar19 == bVar24)) break;
            uVar29 = uVar29 + (bVar19 == 10);
            bVar39 = bVar25 == 0x5c;
            bVar25 = bVar19;
            if (bVar39) {
              bVar25 = 0;
            }
            bVar19 = pbVar33[1];
            pbVar33 = pbVar33 + 1;
          } while (bVar19 != 0);
        }
      }
    }
    else if (bVar24 == 0x2f) {
      if (pbVar13[2] == 0x2f) {
        for (pbVar33 = pbVar13 + 3; *pbVar33 != 0; pbVar33 = pbVar33 + 1) {
          if (*pbVar33 == 10) goto LAB_00106b56;
        }
      }
      else if (pbVar13[2] == 0x2a) {
        pbVar33 = pbVar13 + 3;
        if (pbVar13[3] != 0) {
          bVar24 = 0;
          bVar19 = pbVar13[3];
          do {
            if (bVar24 == 0x2a && bVar19 == 0x2f) break;
            uVar29 = uVar29 + (bVar19 == 10);
            pbVar34 = pbVar33 + 1;
            pbVar33 = pbVar33 + 1;
            bVar24 = bVar19;
            bVar19 = *pbVar34;
          } while (*pbVar34 != 0);
        }
      }
    }
    else if (bVar24 == 0x7b) {
      iVar3 = iVar3 + 1;
    }
    else if (bVar24 == 0x7d) {
      iVar3 = iVar3 + -1;
    }
    bVar24 = pbVar33[1];
    pbVar34 = pbVar33 + 1;
    pbVar13 = pbVar33;
  } while (bVar24 != 0);
LAB_001076c2:
  pbVar33 = pbVar34;
  uStack_3f50 = uVar28;
  pbStack_3f48 = pbVar32;
  ErrorMsg(pcStack_3f58,uVar28,
           "C code starting on this line is not terminated before the end of the file.");
  uStack_3f4c = uStack_3f4c + 1;
  pbVar34 = pbVar33;
LAB_00106b90:
  bVar24 = *pbVar33;
  *pbVar33 = 0;
  pbVar32 = (byte *)Strsafe((char *)pbStack_3f48);
  prVar14 = prStack_88;
  uVar28 = uStack_3f10;
  psVar6 = psStack_3f28;
  psVar5 = psStack_3f30;
  switch(uStack_3f38) {
  case 0:
    prStack_88 = (rule *)0x0;
    uStack_4c = 0;
    iStack_5c = 0;
    lStack_58 = 0;
    uStack_50 = 0;
    *(undefined4 *)(lStack_3f40 + 0x20) = 0;
  case 1:
    uVar9 = (ulong)*pbVar32;
    if (uVar9 == 0x25) {
LAB_001070e4:
      uStack_3f38 = 2;
    }
    else if ((*(byte *)((long)*ppuVar8 + uVar9 * 2 + 1) & 2) == 0) {
      if (uVar9 == 0x5b) {
        uStack_3f38 = 0xc;
      }
      else if (*pbVar32 == 0x7b) {
        if (prStack_88 == (rule *)0x0) {
          Parse_cold_9();
          psVar5 = psStack_3f30;
        }
        else if (prStack_88->code == (char *)0x0) {
          prStack_88->line = uStack_3f50;
          prStack_88->code = (char *)(pbVar32 + 1);
          prStack_88->noCode = 0;
        }
        else {
          Parse_cold_8();
          psVar5 = psStack_3f30;
        }
      }
      else {
        pcVar7 = "Token \"%s\" should be either \"%%\" or a nonterminal name.";
LAB_00107c81:
        ErrorMsg(pcStack_3f58,uStack_3f50,pcVar7,pbVar32);
        uStack_3f4c = uStack_3f4c + 1;
        psVar5 = psStack_3f30;
      }
    }
    else {
      psStack_3f20 = Symbol_new((char *)pbVar32);
      uStack_3f10 = 0;
      pbStack_3f18 = (byte *)0x0;
      uStack_3f38 = 5;
      psVar5 = psStack_3f30;
    }
    goto switchD_00106bca_default;
  case 2:
    if ((*(byte *)((long)*ppuVar8 + (ulong)*pbVar32 * 2 + 1) & 4) != 0) {
      ppcStack_78 = (char **)0x0;
      piStack_68 = (int *)0x0;
      iStack_70 = 1;
      uStack_3f38 = 3;
      pbStack_80 = pbVar32;
      iVar3 = strcmp((char *)pbVar32,"name");
      if (iVar3 == 0) {
        ppcStack_78 = (char **)(lStack_3f40 + 0x50);
        goto LAB_00107624;
      }
      iVar3 = strcmp((char *)pbVar32,"include");
      if (iVar3 == 0) {
        ppcStack_78 = (char **)(lStack_3f40 + 0x80);
        psVar5 = psStack_3f30;
        goto switchD_00106bca_default;
      }
      iVar3 = strcmp((char *)pbVar32,"code");
      if (iVar3 == 0) {
        lVar11 = 0xa8;
      }
      else {
        iVar3 = strcmp((char *)pbVar32,"token_destructor");
        if (iVar3 == 0) {
          lVar11 = 0xb0;
        }
        else {
          iVar3 = strcmp((char *)pbVar32,"default_destructor");
          if (iVar3 == 0) {
            lVar11 = 0xb8;
          }
          else {
            iVar3 = strcmp((char *)pbVar32,"token_prefix");
            if (iVar3 == 0) {
              ppcStack_78 = (char **)(lStack_3f40 + 0xd8);
LAB_00107624:
              iStack_70 = 0;
              psVar5 = psStack_3f30;
              goto switchD_00106bca_default;
            }
            iVar3 = strcmp((char *)pbVar32,"syntax_error");
            if (iVar3 == 0) {
              lVar11 = 0x88;
            }
            else {
              iVar3 = strcmp((char *)pbVar32,"parse_accept");
              if (iVar3 == 0) {
                lVar11 = 0xa0;
              }
              else {
                iVar3 = strcmp((char *)pbVar32,"parse_failure");
                if (iVar3 == 0) {
                  lVar11 = 0x98;
                }
                else {
                  iVar3 = strcmp((char *)pbVar32,"stack_overflow");
                  if (iVar3 != 0) {
                    iVar3 = strcmp((char *)pbVar32,"extra_argument");
                    if (iVar3 == 0) {
                      ppcStack_78 = (char **)(lStack_3f40 + 0x58);
                    }
                    else {
                      iVar3 = strcmp((char *)pbVar32,"token_type");
                      if (iVar3 == 0) {
                        ppcStack_78 = (char **)(lStack_3f40 + 0x60);
                      }
                      else {
                        iVar3 = strcmp((char *)pbVar32,"default_type");
                        if (iVar3 == 0) {
                          ppcStack_78 = (char **)(lStack_3f40 + 0x68);
                        }
                        else {
                          iVar3 = strcmp((char *)pbVar32,"stack_size");
                          if (iVar3 == 0) {
                            ppcStack_78 = (char **)(lStack_3f40 + 0x78);
                          }
                          else {
                            iVar3 = strcmp((char *)pbVar32,"start_symbol");
                            if (iVar3 != 0) {
                              iVar3 = strcmp((char *)pbVar32,"left");
                              if (iVar3 == 0) {
                                iStack_5c = iStack_5c + 1;
                                uStack_60 = 0;
                              }
                              else {
                                iVar3 = strcmp((char *)pbVar32,"right");
                                if (iVar3 == 0) {
                                  iStack_5c = iStack_5c + 1;
                                  uStack_60 = 1;
                                }
                                else {
                                  iVar3 = strcmp((char *)pbVar32,"nonassoc");
                                  if (iVar3 != 0) {
                                    iVar3 = strcmp((char *)pbVar32,"destructor");
                                    if (iVar3 == 0) {
                                      uStack_3f38 = 0x10;
                                      psVar5 = psStack_3f30;
                                      goto switchD_00106bca_default;
                                    }
                                    iVar3 = strcmp((char *)pbVar32,"type");
                                    if (iVar3 == 0) {
                                      uStack_3f38 = 0x11;
                                      psVar5 = psStack_3f30;
                                      goto switchD_00106bca_default;
                                    }
                                    iVar3 = strcmp((char *)pbVar32,"fallback");
                                    if (iVar3 == 0) {
                                      psStack_3f30 = (symbol *)0x0;
                                      uStack_3f38 = 0x12;
                                      psVar5 = psStack_3f30;
                                      goto switchD_00106bca_default;
                                    }
                                    iVar3 = strcmp((char *)pbVar32,"wildcard");
                                    if (iVar3 == 0) {
                                      uStack_3f38 = 0x13;
                                      psVar5 = psStack_3f30;
                                      goto switchD_00106bca_default;
                                    }
                                    iVar3 = strcmp((char *)pbVar32,"token_class");
                                    if (iVar3 == 0) {
                                      uStack_3f38 = 0x14;
                                      psVar5 = psStack_3f30;
                                      goto switchD_00106bca_default;
                                    }
                                    pcVar7 = "Unknown declaration keyword: \"%%%s\".";
                                    goto LAB_00107bdb;
                                  }
                                  iStack_5c = iStack_5c + 1;
                                  uStack_60 = 2;
                                }
                              }
                              uStack_3f38 = 4;
                              psVar5 = psStack_3f30;
                              goto switchD_00106bca_default;
                            }
                            ppcStack_78 = (char **)(lStack_3f40 + 0x70);
                          }
                        }
                      }
                    }
                    goto LAB_00107624;
                  }
                  lVar11 = 0x90;
                }
              }
            }
          }
        }
      }
      ppcStack_78 = (char **)(lStack_3f40 + lVar11);
      psVar5 = psStack_3f30;
      goto switchD_00106bca_default;
    }
    pcVar7 = "Illegal declaration keyword: \"%s\".";
    goto LAB_00107bdb;
  case 3:
    bVar19 = *pbVar32;
    if (((bVar19 == 0x22) || (bVar19 == 0x7b)) || (((*ppuVar8)[bVar19] & 8) != 0)) {
      if (((ulong)bVar19 == 0x7b) || (bVar19 == 0x22)) {
        pbVar32 = pbVar32 + 1;
      }
      sVar10 = strlen((char *)pbVar32);
      ppcVar37 = ppcStack_78;
      pcVar7 = *ppcStack_78;
      pcVar27 = pcVar7;
      if (pcVar7 == (char *)0x0) {
        pcVar27 = "";
      }
      sVar30 = strlen(pcVar27);
      iVar3 = (int)sVar10;
      iVar23 = (int)sVar30;
      iVar4 = iVar3 + iVar23 + 0x14;
      if ((*(int *)(lStack_3f40 + 0xf4) == 0) && (iStack_70 != 0)) {
        if ((piStack_68 == (int *)0x0) || (*piStack_68 != 0)) {
          iVar22 = 0;
          pcVar7 = pcStack_3f58;
          do {
            if (*pcVar7 == '\\') {
              iVar22 = iVar22 + 1;
            }
            else if (*pcVar7 == '\0') goto LAB_001075ad;
            pcVar7 = pcVar7 + 1;
          } while( true );
        }
        bVar39 = false;
        sStack_3fe8 = 0;
      }
      else {
        sStack_3fe8 = 0;
        bVar39 = false;
      }
      goto LAB_00107776;
    }
    ErrorMsg(pcStack_3f58,uStack_3f50,"Illegal argument to %%%s: %s",pbStack_80,pbVar32);
    goto LAB_00107be2;
  case 4:
    if ((ulong)*pbVar32 == 0x2e) break;
    if ((*(byte *)((long)*ppuVar8 + (ulong)*pbVar32 * 2 + 1) & 1) == 0) {
      pcVar7 = "Can\'t assign a precedence to \"%s\".";
    }
    else {
      psVar6 = Symbol_new((char *)pbVar32);
      if (psVar6->prec < 0) {
        psVar6->prec = iStack_5c;
        psVar6->assoc = uStack_60;
        psVar5 = psStack_3f30;
        goto switchD_00106bca_default;
      }
      pcVar7 = "Symbol \"%s\" has already be given a precedence.";
    }
    goto LAB_00107c81;
  case 5:
    if (*pbVar32 == 0x28) {
      uStack_3f38 = 7;
      goto switchD_00106bca_default;
    }
    if (((*pbVar32 != 0x3a) || (pbVar32[1] != 0x3a)) || (pbVar32[2] != 0x3d)) {
      pbVar32 = (byte *)psStack_3f20->name;
      pcVar7 = "Expected to see a \":\" following the LHS symbol \"%s\".";
      goto LAB_0010788c;
    }
    goto LAB_001071d5;
  case 6:
    bVar19 = *pbVar32;
    uVar9 = (ulong)bVar19;
    if (uVar9 != 0x2e) {
      if ((*(byte *)((long)*ppuVar8 + uVar9 * 2 + 1) & 4) == 0) {
        if (uVar9 == 0x28) {
          if (0 < (int)uStack_3f10) {
            uStack_3f38 = 10;
            goto switchD_00106bca_default;
          }
        }
        else if (((bVar19 == 0x7c) || (bVar19 == 0x2f)) && (0 < (int)uStack_3f10)) {
          uVar28 = uStack_3f10 - 1;
          puVar15 = (undefined8 *)alStack_3f08[uVar28];
          if (*(int *)((long)puVar15 + 0xc) == 2) {
            __ptr = (long *)puVar15[0xb];
            iVar3 = *(int *)((long)puVar15 + 0x54) + 1;
            puVar17 = puVar15;
          }
          else {
            puVar17 = (undefined8 *)calloc(1,0x60);
            *(undefined4 *)((long)puVar17 + 0xc) = 2;
            *(undefined4 *)((long)puVar17 + 0x54) = 1;
            __ptr = (long *)calloc(1,8);
            puVar17[0xb] = __ptr;
            *__ptr = (long)puVar15;
            *puVar17 = *puVar15;
            alStack_3f08[uVar28] = (long)puVar17;
            iVar3 = 2;
          }
          *(int *)((long)puVar17 + 0x54) = iVar3;
          pvVar18 = realloc(__ptr,(long)iVar3 << 3);
          puVar17[0xb] = pvVar18;
          psVar6 = Symbol_new((char *)(pbVar32 + 1));
          *(symbol **)(puVar17[0xb] + -8 + (long)*(int *)((long)puVar17 + 0x54) * 8) = psVar6;
          if (((*(byte *)((long)*ppuVar8 + (ulong)pbVar32[1] * 2 + 1) & 2) != 0) ||
             (psVar5 = psStack_3f30,
             (*(byte *)((long)*ppuVar8 + (ulong)*(byte *)**(undefined8 **)puVar17[0xb] * 2 + 1) & 2)
             != 0)) {
            Parse_cold_3();
            psVar5 = psStack_3f30;
          }
          goto switchD_00106bca_default;
        }
        pcVar7 = "Illegal character on RHS of rule: \"%s\".";
      }
      else {
        lVar11 = (long)(int)uStack_3f10;
        if (lVar11 < 1000) {
          psVar6 = Symbol_new((char *)pbVar32);
          alStack_3f08[lVar11] = (long)psVar6;
          auStack_1fd0[lVar11 + 1] = 0;
          uStack_3f10 = uVar28 + 1;
          psVar5 = psStack_3f30;
          goto switchD_00106bca_default;
        }
        pcVar7 = "Too many symbols on RHS of rule beginning at \"%s\".";
      }
      goto LAB_0010788c;
    }
    uVar9 = (ulong)uStack_3f10;
    lVar11 = (long)(int)uStack_3f10;
    prVar14 = (rule *)calloc(lVar11 * 0x10 + 0x80,1);
    if (prVar14 == (rule *)0x0) {
      Parse_cold_4();
      prStack_88 = prVar14;
    }
    else {
      prVar14->ruleline = uStack_3f50;
      prVar14->rhs = &prVar14[1].lhs;
      prVar14->rhsalias = (char **)(&prVar14[1].lhs + lVar11);
      if (0 < (int)uVar28) {
        uVar35 = 0;
        do {
          prVar14->rhs[uVar35] = (symbol *)alStack_3f08[uVar35];
          prVar14->rhsalias[uVar35] = (char *)auStack_1fd0[uVar35 + 1];
          uVar35 = uVar35 + 1;
        } while (uVar9 != uVar35);
      }
      prVar14->lhs = psStack_3f20;
      prVar14->lhsalias = (char *)pbStack_3f18;
      prVar14->nrhs = uVar28;
      prVar14->code = (char *)0x0;
      prVar14->noCode = 1;
      prVar14->precsym = (symbol *)0x0;
      iVar3 = *(int *)(lStack_3f40 + 0x20);
      *(int *)(lStack_3f40 + 0x20) = iVar3 + 1;
      prVar14->index = iVar3;
      prVar14->nextlhs = psStack_3f20->rule;
      psStack_3f20->rule = prVar14;
      prVar14->next = (rule *)0x0;
      puVar15 = (undefined8 *)(CONCAT44(uStack_4c,uStack_50) + 0x78);
      if (lStack_58 == 0) {
        puVar15 = (undefined8 *)&uStack_50;
      }
      *puVar15 = prVar14;
      (&lStack_58)[lStack_58 != 0] = (long)prVar14;
      prStack_88 = prVar14;
    }
    break;
  case 7:
    if ((*(byte *)((long)*ppuVar8 + (ulong)*pbVar32 * 2 + 1) & 4) != 0) {
      uStack_3f38 = 8;
      pbStack_3f18 = pbVar32;
      goto switchD_00106bca_default;
    }
    pbVar13 = (byte *)psStack_3f20->name;
    pcVar7 = "\"%s\" is not a valid alias for the LHS \"%s\"\n";
    goto LAB_00107a6e;
  case 8:
    if (*pbVar32 == 0x29) {
      uStack_3f38 = 9;
      goto switchD_00106bca_default;
    }
LAB_00107737:
    pcVar7 = "Missing \")\" following LHS alias name \"%s\".";
    pbVar32 = pbStack_3f18;
LAB_0010788c:
    ErrorMsg(pcStack_3f58,uStack_3f50,pcVar7,pbVar32);
    goto LAB_00107a75;
  case 9:
    if (((*pbVar32 != 0x3a) || (pbVar32[1] != 0x3a)) || (pbVar32[2] != 0x3d)) {
      pbVar32 = (byte *)psStack_3f20->name;
      pcVar7 = "Missing \"->\" following: \"%s(%s)\".";
      pbVar13 = pbStack_3f18;
      goto LAB_00107a6e;
    }
    goto LAB_001071d5;
  case 10:
    if ((*(byte *)((long)*ppuVar8 + (ulong)*pbVar32 * 2 + 1) & 4) != 0) {
      auStack_1fd0[(int)uStack_3f10] = pbVar32;
      uStack_3f38 = 0xb;
      goto switchD_00106bca_default;
    }
    pbVar13 = *(byte **)alStack_3f08[(long)(int)uStack_3f10 + -1];
    pcVar7 = "\"%s\" is not a valid alias for the RHS symbol \"%s\"\n";
LAB_00107a6e:
    ErrorMsg(pcStack_3f58,uStack_3f50,pcVar7,pbVar32,pbVar13);
LAB_00107a75:
    uStack_3f4c = uStack_3f4c + 1;
    uStack_3f38 = 0xe;
    psVar5 = psStack_3f30;
    goto switchD_00106bca_default;
  case 0xb:
    if (*pbVar32 != 0x29) goto LAB_00107737;
LAB_001071d5:
    uStack_3f38 = 6;
    goto switchD_00106bca_default;
  case 0xc:
    if ((*(byte *)((long)*ppuVar8 + (ulong)*pbVar32 * 2 + 1) & 1) == 0) {
      Parse_cold_7();
    }
    else if (prStack_88 == (rule *)0x0) {
      ErrorMsg(pcStack_3f58,uStack_3f50,"There is no prior rule to assign precedence \"[%s]\".");
      uStack_3f4c = uStack_3f4c + 1;
    }
    else if (prStack_88->precsym == (symbol *)0x0) {
      psVar6 = Symbol_new((char *)pbVar32);
      prVar14->precsym = psVar6;
    }
    else {
      Parse_cold_6();
    }
    uStack_3f38 = 0xd;
    psVar5 = psStack_3f30;
    goto switchD_00106bca_default;
  case 0xd:
    if (*pbVar32 != 0x5d) {
      Parse_cold_5();
    }
    break;
  case 0xe:
  case 0xf:
    bVar19 = *pbVar32;
    if (bVar19 == 0x2e) {
      uStack_3f38 = 1;
      bVar19 = *pbVar32;
    }
    if (bVar19 != 0x25) goto switchD_00106bca_default;
    goto LAB_001070e4;
  case 0x10:
    if ((*(byte *)((long)*ppuVar8 + (ulong)*pbVar32 * 2 + 1) & 4) != 0) {
      psVar6 = Symbol_new((char *)pbVar32);
      ppcStack_78 = &psVar6->destructor;
      piStack_68 = &psVar6->destLineno;
      iStack_70 = 1;
      uStack_3f38 = 3;
      psVar5 = psStack_3f30;
      goto switchD_00106bca_default;
    }
    pcVar7 = "Symbol name missing after %%destructor keyword";
    goto LAB_00107a1b;
  case 0x11:
    if ((*(byte *)((long)*ppuVar8 + (ulong)*pbVar32 * 2 + 1) & 4) != 0) {
      psVar6 = Symbol_find((char *)pbVar32);
      if (psVar6 == (symbol *)0x0) {
        psVar6 = Symbol_new((char *)pbVar32);
      }
      else if (psVar6->datatype != (char *)0x0) {
        ErrorMsg(pcStack_3f58,uStack_3f50,"Symbol %%type \"%s\" already defined",pbVar32);
        uStack_3f4c = uStack_3f4c + 1;
        uStack_3f38 = 0xf;
        psVar5 = psStack_3f30;
        goto switchD_00106bca_default;
      }
      ppcStack_78 = &psVar6->datatype;
      iStack_70 = 0;
      uStack_3f38 = 3;
      psVar5 = psStack_3f30;
      goto switchD_00106bca_default;
    }
    pcVar7 = "Symbol name missing after %%type keyword";
LAB_00107a1b:
    ErrorMsg(pcStack_3f58,uStack_3f50,pcVar7);
    goto LAB_00107be2;
  case 0x12:
    if ((ulong)*pbVar32 != 0x2e) {
      if ((*(byte *)((long)*ppuVar8 + (ulong)*pbVar32 * 2 + 1) & 1) == 0) {
        pcVar7 = "%%fallback argument \"%s\" should be a token";
      }
      else {
        psVar5 = Symbol_new((char *)pbVar32);
        if (psStack_3f30 == (symbol *)0x0) goto switchD_00106bca_default;
        if (psVar5->fallback == (symbol *)0x0) {
          psVar5->fallback = psStack_3f30;
          *(undefined4 *)(lStack_3f40 + 0xf0) = 1;
          psVar5 = psStack_3f30;
          goto switchD_00106bca_default;
        }
        pcVar7 = "More than one fallback assigned to token %s";
      }
      goto LAB_00107c81;
    }
    break;
  case 0x13:
    if ((ulong)*pbVar32 != 0x2e) {
      if ((*(byte *)((long)*ppuVar8 + (ulong)*pbVar32 * 2 + 1) & 1) == 0) {
        pcVar7 = "%%wildcard argument \"%s\" should be a token";
      }
      else {
        psVar6 = Symbol_new((char *)pbVar32);
        if (*(long *)(lStack_3f40 + 0x40) == 0) {
          *(symbol **)(lStack_3f40 + 0x40) = psVar6;
          psVar5 = psStack_3f30;
          goto switchD_00106bca_default;
        }
        pcVar7 = "Extra wildcard to token: %s";
      }
      goto LAB_00107c81;
    }
    break;
  case 0x14:
    if ((*(byte *)((long)*ppuVar8 + (ulong)*pbVar32 * 2 + 1) & 2) == 0) {
      pcVar7 = "%%token_class must be followed by an identifier: ";
    }
    else {
      psVar6 = Symbol_find((char *)pbVar32);
      if (psVar6 == (symbol *)0x0) {
        psStack_3f28 = Symbol_new((char *)pbVar32);
        psStack_3f28->type = MULTITERMINAL;
        uStack_3f38 = 0x15;
        psVar5 = psStack_3f30;
        goto switchD_00106bca_default;
      }
      pcVar7 = "Symbol \"%s\" already used";
    }
    goto LAB_00107bdb;
  case 0x15:
    uVar9 = (ulong)*pbVar32;
    if (uVar9 == 0x2e) break;
    if (((*(byte *)((long)*ppuVar8 + uVar9 * 2 + 1) & 1) != 0) ||
       (((uVar9 == 0x7c || (*pbVar32 == 0x2f)) &&
        ((*(byte *)((long)*ppuVar8 + (ulong)pbVar32[1] * 2 + 1) & 1) != 0)))) {
      iVar3 = psStack_3f28->nsubsym;
      psStack_3f28->nsubsym = iVar3 + 1;
      ppsVar16 = (symbol **)realloc(psStack_3f28->subsym,(long)iVar3 * 8 + 8);
      psVar6->subsym = ppsVar16;
      psVar5 = Symbol_new((char *)(pbVar32 + (((*ppuVar8)[*pbVar32] >> 8 & 1) == 0)));
      psVar6->subsym[(long)psVar6->nsubsym + -1] = psVar5;
      psVar5 = psStack_3f30;
      goto switchD_00106bca_default;
    }
    pcVar7 = "%%token_class argument \"%s\" should be a token";
LAB_00107bdb:
    ErrorMsg(pcStack_3f58,uStack_3f50,pcVar7,pbVar32);
LAB_00107be2:
    uStack_3f4c = uStack_3f4c + 1;
    uStack_3f38 = 0xf;
    psVar5 = psStack_3f30;
  default:
    goto switchD_00106bca_default;
  }
LAB_00107842:
  uStack_3f38 = 1;
  psVar5 = psStack_3f30;
switchD_00106bca_default:
  psStack_3f30 = psVar5;
  *pbVar33 = bVar24;
  uVar28 = uVar29;
  goto LAB_001068e9;
LAB_001075ad:
  sprintf(acStack_3f90,"#line %d ",(ulong)uStack_3f50);
  sVar10 = strlen(acStack_3f90);
  sVar30 = strlen(pcStack_3f58);
  iVar4 = iVar22 + iVar4 + (int)sVar10 + (int)sVar30;
  sStack_3fe8 = (size_t)(int)sVar10;
  pcVar7 = *ppcStack_78;
  bVar39 = true;
  ppcVar37 = ppcStack_78;
LAB_00107776:
  pcVar7 = (char *)realloc(pcVar7,(long)iVar4);
  *ppcVar37 = pcVar7;
  pcVar7 = *ppcStack_78 + iVar23;
  if (bVar39) {
    if ((iVar23 != 0) && (pcVar7[-1] != '\n')) {
      *pcVar7 = '\n';
      pcVar7 = pcVar7 + 1;
    }
    memcpy(pcVar7,acStack_3f90,sStack_3fe8);
    pcVar27 = pcVar7 + sStack_3fe8;
    pcVar7[sStack_3fe8] = '\"';
    pcVar7 = pcStack_3f58;
    do {
      cVar21 = *pcVar7;
      if (cVar21 == '\\') {
        pcVar27[1] = '\\';
        pcVar27 = pcVar27 + 2;
        cVar21 = *pcVar7;
      }
      else {
        if (cVar21 == '\0') goto LAB_00107802;
        pcVar27 = pcVar27 + 1;
      }
      *pcVar27 = cVar21;
      pcVar7 = pcVar7 + 1;
    } while( true );
  }
  goto LAB_0010780f;
LAB_00107802:
  pcVar27[1] = '\"';
  pcVar27[2] = '\n';
  pcVar7 = pcVar27 + 3;
LAB_0010780f:
  if ((piStack_68 != (int *)0x0) && (*piStack_68 == 0)) {
    *piStack_68 = uStack_3f50;
  }
  memcpy(pcVar7,pbVar32,(long)iVar3);
  pcVar7[iVar3] = '\0';
  goto LAB_00107842;
}

Assistant:

struct symbol *Symbol_new(const char *x)
{
  struct symbol *sp;

  sp = Symbol_find(x);
  if( sp==0 ){
    sp = (struct symbol *)calloc(1, sizeof(struct symbol) );
    MemoryCheck(sp);
    sp->name = Strsafe(x);
    sp->type = ISUPPER(*x) ? TERMINAL : NONTERMINAL;
    sp->rule = 0;
    sp->fallback = 0;
    sp->prec = -1;
    sp->assoc = UNK;
    sp->firstset = 0;
    sp->lambda = LEMON_FALSE;
    sp->destructor = 0;
	sp->destLineno = 0;
    sp->datatype = 0;
	sp->useCnt = 0;
    Symbol_insert(sp,sp->name);
  }
  sp->useCnt++;
  return sp;
}